

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)'\x00'>::dec
          (basic_dynamic_gauge<long,_(unsigned_char)__x00_> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
          *labels_value,long value)

{
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_bool>
  local_28;
  
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::
  try_emplace<std::array<std::__cxx11::string,0ul>const&>
            (&local_28,(dynamic_metric_impl<std::atomic<long>,(unsigned_char)0> *)this,labels_value)
  ;
  LOCK();
  ((local_28.first.
    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->value).super___atomic_base<long>._M_i =
       ((local_28.first.
         super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->value).super___atomic_base<long>._M_i - value;
  UNLOCK();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.first.
              super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void dec(const std::array<std::string, N>& labels_value,
           value_type value = 1) {
    detail::dec_impl(Base::try_emplace(labels_value).first->value, value);
  }